

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void print_errors(vector<ErrorInfoException,_std::allocator<ErrorInfoException>_> *errors)

{
  pointer pEVar1;
  enableStd<rang::style> pbVar2;
  enableStd<rang::bg> pbVar3;
  ostream *poVar4;
  char *pcVar5;
  ErrorInfoException *it;
  pointer pEVar6;
  
  pbVar2 = rang::operator<<((ostream *)&std::cout,bold);
  pbVar3 = rang::operator<<(pbVar2,red);
  poVar4 = std::operator<<(pbVar3,anon_var_dwarf_51fd);
  pbVar2 = rang::operator<<(poVar4,reset);
  pbVar3 = rang::operator<<(pbVar2,reset);
  std::endl<char,std::char_traits<char>>(pbVar3);
  rang::operator<<((ostream *)&std::cout,red);
  pEVar1 = (errors->super__Vector_base<ErrorInfoException,_std::allocator<ErrorInfoException>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pEVar6 = (errors->super__Vector_base<ErrorInfoException,_std::allocator<ErrorInfoException>_>
                )._M_impl.super__Vector_impl_data._M_start; pEVar6 != pEVar1; pEVar6 = pEVar6 + 1) {
    pcVar5 = (char *)(**(code **)(*(long *)pEVar6 + 0x10))(pEVar6);
    poVar4 = std::operator<<((ostream *)&std::cout,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  rang::operator<<((ostream *)&std::cout,reset);
  return;
}

Assistant:

void print_errors(const vector<ErrorInfoException> &errors) {
    cout << style::bold << bg::red << "\t\t\t错误表" << style::reset << bg::reset << endl;
    cout << fg::red;
    for (const auto &it : errors) {
        cout << it.what() << endl;
    }
    cout << fg::reset;
}